

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

BuildNode * __thiscall
anon_unknown.dwarf_35995e::BuildSystemEngineDelegate::lookupNode
          (BuildSystemEngineDelegate *this,StringRef name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BuildDescription *this_00;
  BuildNode *pBVar2;
  int iVar3;
  ulong uVar4;
  StringMapEntryBase **ppSVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  undefined1 isImplicit;
  BuildDescription *pBVar8;
  char *pcVar9;
  key_type local_58;
  StringMapEntryBase local_38;
  
  pcVar9 = name.Data;
  this_00 = (this->system->buildDescription)._M_t.
            super___uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
            .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl;
  if (this_00 != (BuildDescription *)0x0) {
    iVar3 = llvm::StringMapImpl::FindKey((StringMapImpl *)this_00,name);
    uVar4 = (long)iVar3;
    if (iVar3 == -1) {
      uVar4 = (ulong)*(uint *)((long)&(this_00->nodes).super_StringMapImpl + 8);
    }
    pBVar8 = (this->system->buildDescription)._M_t.
             super___uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
             .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl;
    if (pBVar8 != (BuildDescription *)0x0) {
      ppSVar5 = (this_00->nodes).super_StringMapImpl.TheTable + uVar4;
      if (ppSVar5 ==
          (StringMapEntryBase **)
          (*(long *)&(pBVar8->nodes).super_StringMapImpl +
          (ulong)*(uint *)((long)&(pBVar8->nodes).super_StringMapImpl + 8) * 8)) {
        paVar1 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        if (pcVar9 == (char *)0x0) {
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,pcVar9,pcVar9 + name.Length);
        }
        isImplicit = SUB81(pBVar8,0);
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->dynamicNodes)._M_h,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          BuildSystemImpl::createNode
                    ((BuildSystemImpl *)&stack0xffffffffffffffc8,name,(bool)isImplicit);
          if (pcVar9 == (char *)0x0) {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_58._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,pcVar9,pcVar9 + name.Length);
          }
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->dynamicNodes,&local_58);
          pBVar2 = (pmVar7->_M_t).
                   super___uniq_ptr_impl<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::buildsystem::BuildNode_*,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                   .super__Head_base<0UL,_llbuild::buildsystem::BuildNode_*,_false>._M_head_impl;
          (pmVar7->_M_t).
          super___uniq_ptr_impl<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_llbuild::buildsystem::BuildNode_*,_std::default_delete<llbuild::buildsystem::BuildNode>_>
          .super__Head_base<0UL,_llbuild::buildsystem::BuildNode_*,_false>._M_head_impl =
               (BuildNode *)local_38.StrLen;
          if (pBVar2 != (BuildNode *)0x0) {
            (**(code **)((long)(pBVar2->super_Node)._vptr_Node + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          local_38.StrLen =
               *(size_t *)
                ((long)iVar6.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
                       ._M_cur + 0x28);
        }
      }
      else {
        local_38.StrLen = (*ppSVar5)[1].StrLen;
      }
      return (BuildNode *)local_38.StrLen;
    }
  }
  __assert_fail("buildDescription",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                ,0x10b,
                "const BuildDescription &(anonymous namespace)::BuildSystemImpl::getBuildDescription() const"
               );
}

Assistant:

BuildNode *BuildSystemEngineDelegate::lookupNode(StringRef name) {
  // Find the node.
  auto it = getBuildDescription().getNodes().find(name);
  BuildNode* node;
  if (it != getBuildDescription().getNodes().end()) {
    node = static_cast<BuildNode*>(it->second.get());
  } else {
    auto it = dynamicNodes.find(name);
    if (it != dynamicNodes.end()) {
      node = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto nodeOwner = system.createNode(
                                         name, /*isImplicit=*/true);
      node = nodeOwner.get();
      dynamicNodes[name] = std::move(nodeOwner);
    }
  }
  return node;
}